

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::QueryVertexInterleaved::QueryVertexInterleaved
          (QueryVertexInterleaved *this,Context *context,char *test_name,char *test_description)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,test_name,test_description);
  (this->super_CaptureVertexInterleaved).super_TestCase.m_context = context;
  (this->super_CaptureVertexInterleaved).m_context = context;
  (this->super_CaptureVertexInterleaved).m_program = 0;
  (this->super_CaptureVertexInterleaved).m_framebuffer = 0;
  (this->super_CaptureVertexInterleaved).m_renderbuffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer_size = 0;
  (this->super_CaptureVertexInterleaved).m_vertex_array_object = 0;
  (this->super_CaptureVertexInterleaved).m_max_transform_feedback_components = 0;
  (this->super_CaptureVertexInterleaved).m_attrib_type = 0x8c8c;
  (this->super_CaptureVertexInterleaved).m_max_vertices_drawn = 3;
  (this->super_CaptureVertexInterleaved).m_glBindBufferOffsetEXT =
       (BindBufferOffsetEXT_ProcAddress)0x0;
  (this->super_CaptureVertexInterleaved).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__CaptureVertexInterleaved_021120a8;
  this->m_query_object = 0;
  return;
}

Assistant:

gl3cts::TransformFeedback::QueryVertexInterleaved::QueryVertexInterleaved(deqp::Context& context, const char* test_name,
																		  const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description), m_query_object(0)
{
	m_max_vertices_drawn = 3; /* Make buffer smaller up to 3 vertices. */
}